

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membuffer.c
# Opt level: O2

int membuffer_insert(membuffer *m,void *buf,size_t buf_len,size_t index)

{
  int iVar1;
  size_t sVar2;
  
  if (m != (membuffer *)0x0) {
    iVar1 = -0x1fa;
    if ((index <= m->length) && (iVar1 = 0, buf_len != 0 && buf != (void *)0x0)) {
      iVar1 = membuffer_set_size(m,m->length + buf_len);
      if (iVar1 == 0) {
        memmove(m->buf + index + buf_len,m->buf + index,m->length - index);
        memcpy(m->buf + index,buf,buf_len);
        sVar2 = buf_len + m->length;
        m->length = sVar2;
        m->buf[sVar2] = '\0';
        iVar1 = 0;
      }
    }
    return iVar1;
  }
  __assert_fail("m != NULL",".upnp/src/genlib/util/membuffer.c",0xde,
                "int membuffer_insert(membuffer *, const void *, size_t, size_t)");
}

Assistant:

int membuffer_insert(
	membuffer *m, const void *buf, size_t buf_len, size_t index)
{
	int return_code;

	assert(m != NULL);

	if (index > m->length)
		return UPNP_E_OUTOF_BOUNDS;
	if (!buf || !buf_len) {
		return 0;
	}
	/* alloc mem */
	return_code = membuffer_set_size(m, m->length + buf_len);
	if (return_code) {
		return return_code;
	}
	/* insert data */
	/* move data to right of insertion point */
	memmove(m->buf + index + buf_len, m->buf + index, m->length - index);
	memcpy(m->buf + index, buf, buf_len);
	m->length += buf_len;
	/* null-terminate */
	m->buf[m->length] = 0;

	return 0;
}